

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

bool __thiscall xmrig::CudaBackend::isEnabled(CudaBackend *this)

{
  bool bVar1;
  Config *this_00;
  CudaConfig *this_01;
  long in_RDI;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *unaff_retaddr;
  undefined1 local_9;
  
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  this_01 = Config::cuda(this_00);
  bVar1 = CudaConfig::isEnabled(this_01);
  local_9 = 0;
  if (bVar1) {
    bVar1 = CudaLib::isInitialized();
    local_9 = 0;
    if (bVar1) {
      bVar1 = std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::empty
                        (unaff_retaddr);
      local_9 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool xmrig::CudaBackend::isEnabled() const
{
    return d_ptr->controller->config()->cuda().isEnabled() && CudaLib::isInitialized() && !d_ptr->devices.empty();;
}